

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_gold(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  byte unaff_R15B;
  
  bVar4 = false;
  do {
    if (*argument == '\0') {
      send_to_char("Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r",ch);
      bVar2 = 0;
LAB_00368a73:
      if (bVar4) {
        bVar2 = unaff_R15B;
      }
      return (bool)(bVar2 & 1);
    }
    pvVar1 = ch->desc->pEdit;
    iVar3 = flag_lookup(argument,wealth_table);
    if (iVar3 != -99) {
      *(int *)((long)pvVar1 + 0x120) = iVar3;
      send_to_char("Wealth set.\n\r",ch);
      bVar2 = 1;
      goto LAB_00368a73;
    }
    unaff_R15B = unaff_R15B & bVar4;
    bVar4 = true;
    argument = "";
  } while( true );
}

Assistant:

bool medit_gold(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int index;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  wealth [none/poor/moderate/affluent/rich/peerless]\n\r", ch);
		return false;
	}

	index = flag_lookup(argument, wealth_table);

	if (index == NO_FLAG)
	{
		medit_gold(ch, "");
		return false;
	}

	pMob->wealth = index;
	send_to_char("Wealth set.\n\r", ch);
	return true;
}